

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t __thiscall
httplib::detail::SocketStream::write(SocketStream *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  int in_stack_00000020;
  socket_t in_stack_00000024;
  size_t in_stack_00000048;
  void *in_stack_00000050;
  
  iVar1 = (*(this->super_Stream)._vptr_Stream[3])(this,CONCAT44(in_register_00000034,__fd));
  if ((char)iVar1 != '\0') {
    sVar2 = send_socket(in_stack_00000024,in_stack_00000050,in_stack_00000048,in_stack_00000020);
    return sVar2;
  }
  return -1;
}

Assistant:

inline ssize_t SocketStream::write(const char *ptr, size_t size) {
  if (!is_writable()) { return -1; }

#if defined(_WIN32) && !defined(_WIN64)
  size =
      (std::min)(size, static_cast<size_t>((std::numeric_limits<int>::max)()));
#endif

  return send_socket(sock_, ptr, size, CPPHTTPLIB_SEND_FLAGS);
}